

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O1

int poptGlob(poptContext con,char *pattern,int *acp,char ***avp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  size_t sVar5;
  char *pcVar6;
  char *__dest;
  poptContext con_00;
  long lVar7;
  glob_t _g;
  void *pvStack_128;
  int iStack_11c;
  stat sStack_118;
  undefined8 uStack_88;
  int *piStack_80;
  poptContext ppStack_78;
  glob_t local_68;
  
  iVar2 = glob_pattern_p((char *)con,0);
  if (iVar2 != 0) {
    iVar3 = 0;
    iVar2 = glob((char *)con,0,poptGlob_error,&local_68);
    if (iVar2 == 3) {
      acp[0] = 0;
      acp[1] = 0;
      pattern[0] = '\0';
      pattern[1] = '\0';
      pattern[2] = '\0';
      pattern[3] = '\0';
    }
    else {
      iVar3 = -0x10;
      if (iVar2 == 0) {
        if (pattern != (char *)0x0) {
          *(undefined4 *)pattern = (undefined4)local_68.gl_pathc;
          local_68.gl_pathc = 0;
        }
        if (acp != (int *)0x0) {
          *(char ***)acp = local_68.gl_pathv;
          local_68.gl_pathv = (char **)0x0;
        }
        globfree(&local_68);
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  if (pattern != (char *)0x0) {
    pattern[0] = '\x01';
    pattern[1] = '\0';
    pattern[2] = '\0';
    pattern[3] = '\0';
  }
  if (acp == (int *)0x0) {
    return 0;
  }
  puVar4 = (undefined8 *)calloc(2,8);
  *(undefined8 **)acp = puVar4;
  if (puVar4 == (undefined8 *)0x0) {
    return 0;
  }
  sVar5 = strlen((char *)con);
  con_00 = (poptContext)(sVar5 + 1);
  pcVar6 = (char *)malloc((size_t)con_00);
  if (pcVar6 == (char *)0x0) {
    poptGlob_cold_1();
    uStack_88 = 0;
    if (con_00->appName != (char *)0x0) {
      piStack_80 = acp;
      ppStack_78 = con;
      iVar2 = poptReadConfigFile(con_00,"/usr/local/etc/popt");
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar3 = stat("/usr/local/etc/popt.d",&sStack_118);
      iVar2 = 0;
      if ((iVar3 == 0) && (iVar2 = 0, (sStack_118.st_mode & 0xf000) == 0x4000)) {
        pvStack_128 = (void *)0x0;
        iStack_11c = 0;
        iVar2 = poptGlob((poptContext)"/usr/local/etc/popt.d/*",(char *)&iStack_11c,
                         (int *)&pvStack_128,avp);
        if (iVar2 == 0) {
          if (iStack_11c < 1) {
            iVar2 = 0;
          }
          else {
            lVar7 = 1;
            do {
              pcVar6 = *(char **)((long)pvStack_128 + lVar7 * 8 + -8);
              iVar2 = poptSaneFile(pcVar6);
              if (iVar2 == 0) {
                iVar2 = 0;
              }
              else {
                iVar2 = poptReadConfigFile(con_00,pcVar6);
                free(*(void **)((long)pvStack_128 + lVar7 * 8 + -8));
                *(undefined8 *)((long)pvStack_128 + lVar7 * 8 + -8) = 0;
              }
            } while ((iVar2 == 0) && (bVar1 = lVar7 < iStack_11c, lVar7 = lVar7 + 1, bVar1));
          }
          free(pvStack_128);
          pvStack_128 = (void *)0x0;
        }
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      pcVar6 = getenv("HOME");
      if (pcVar6 != (char *)0x0) {
        sVar5 = strlen(pcVar6);
        __dest = (char *)malloc(sVar5 + 0x14);
        if (__dest != (char *)0x0) {
          pcVar6 = stpcpy(__dest,pcVar6);
          builtin_strncpy(pcVar6,"/.popt",7);
          iVar2 = poptReadConfigFile(con_00,__dest);
          free(__dest);
          return iVar2;
        }
        return -0x10;
      }
    }
    return 0;
  }
  strcpy(pcVar6,(char *)con);
  *puVar4 = pcVar6;
  return 0;
}

Assistant:

static int poptGlob(UNUSED(poptContext con), const char * pattern,
		int * acp, const char *** avp)
{
    const char * pat = pattern;
    int rc = 0;		/* assume success */

#if defined(HAVE_GLOB_H)
    if (glob_pattern_p(pat, 0)) {
	glob_t _g, *pglob = &_g;

	if (!(rc = glob(pat, poptGlobFlags, poptGlob_error, pglob))) {
	    if (acp) {
		*acp = (int) pglob->gl_pathc;
		pglob->gl_pathc = 0;
	    }
	    if (avp) {
		*avp = (const char **) pglob->gl_pathv;
		pglob->gl_pathv = NULL;
	    }
	    globfree(pglob);
	} else if (rc == GLOB_NOMATCH) {
	    *avp = NULL;
	    *acp = 0;
	    rc = 0;
	} else
	    rc = POPT_ERROR_ERRNO;
    } else
#endif	/* HAVE_GLOB_H */
    {
	if (acp)
	    *acp = 1;
	if (avp && (*avp = calloc((size_t)(1 + 1), sizeof (**avp))) != NULL)
	    (*avp)[0] = xstrdup(pat);
    }

    return rc;
}